

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

bool __thiscall
math::wide_integer::uintwide_t<256u,unsigned_int,void,false>::wr_string<char*>
          (uintwide_t<256u,unsigned_int,void,false> *this,char *str_result,uint_fast8_t base_rep,
          bool show_base,bool show_pos,bool is_uppercase,unsigned_fast_type field_width,
          char fill_char_str)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  undefined8 uVar4;
  value_type_conflict vVar5;
  undefined8 uVar6;
  unsigned_fast_type i;
  long lVar7;
  unsigned_fast_type uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  undefined7 in_register_00000011;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  uintwide_t<256U,_unsigned_int,_void,_false> t_1;
  uintwide_t<256U,_unsigned_int,_void,_false> tmp;
  uintwide_t<256U,_unsigned_int,_void,_false> local_118;
  byte local_f8 [64];
  undefined8 local_b8;
  undefined6 uStack_b0;
  undefined1 local_aa;
  undefined1 uStack_a9;
  undefined5 uStack_a8;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined5 uStack_a1;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  value_type_conflict local_98 [16];
  value_type_conflict local_58 [2];
  value_type_conflict avStack_50 [2];
  value_type_conflict local_48 [2];
  value_type_conflict avStack_40 [4];
  
  iVar12 = (int)CONCAT71(in_register_00000011,base_rep);
  if (iVar12 != 0x10) {
    if (iVar12 == 10) {
      uVar4 = *(undefined8 *)this;
      local_98._16_8_ = *(undefined8 *)(this + 0x10);
      local_98._24_8_ = *(undefined8 *)(this + 0x18);
      local_98[0] = (value_type_conflict)uVar4;
      local_98[1] = SUB84(uVar4,4);
      uVar6 = local_98._0_8_;
      local_98._8_8_ = *(undefined8 *)(this + 8);
      local_b8 = 0;
      uStack_b0 = 0;
      local_aa = 0;
      local_f8[0x30] = 0;
      local_f8[0x31] = 0;
      local_f8[0x32] = 0;
      local_f8[0x33] = 0;
      local_f8[0x34] = 0;
      local_f8[0x35] = 0;
      local_f8[0x36] = 0;
      local_f8[0x37] = 0;
      local_f8[0x38] = 0;
      local_f8[0x39] = 0;
      local_f8[0x3a] = 0;
      local_f8[0x3b] = 0;
      local_f8[0x3c] = 0;
      local_f8[0x3d] = 0;
      local_f8[0x3e] = 0;
      local_f8[0x3f] = 0;
      local_f8[0x20] = 0;
      local_f8[0x21] = 0;
      local_f8[0x22] = 0;
      local_f8[0x23] = 0;
      local_f8[0x24] = 0;
      local_f8[0x25] = 0;
      local_f8[0x26] = 0;
      local_f8[0x27] = 0;
      local_f8[0x28] = 0;
      local_f8[0x29] = 0;
      local_f8[0x2a] = 0;
      local_f8[0x2b] = 0;
      local_f8[0x2c] = 0;
      local_f8[0x2d] = 0;
      local_f8[0x2e] = 0;
      local_f8[0x2f] = 0;
      local_f8[0x10] = 0;
      local_f8[0x11] = 0;
      local_f8[0x12] = 0;
      local_f8[0x13] = 0;
      local_f8[0x14] = 0;
      local_f8[0x15] = 0;
      local_f8[0x16] = 0;
      local_f8[0x17] = 0;
      local_f8[0x18] = 0;
      local_f8[0x19] = 0;
      local_f8[0x1a] = 0;
      local_f8[0x1b] = 0;
      local_f8[0x1c] = 0;
      local_f8[0x1d] = 0;
      local_f8[0x1e] = 0;
      local_f8[0x1f] = 0;
      local_f8[0] = 0;
      local_f8[1] = 0;
      local_f8[2] = 0;
      local_f8[3] = 0;
      local_f8[4] = 0;
      local_f8[5] = 0;
      local_f8[6] = 0;
      local_f8[7] = 0;
      local_f8[8] = 0;
      local_f8[9] = 0;
      local_f8[10] = 0;
      local_f8[0xb] = 0;
      local_f8[0xc] = 0;
      local_f8[0xd] = 0;
      local_f8[0xe] = 0;
      local_f8[0xf] = 0;
      uStack_a9 = 0;
      uStack_a8 = 0;
      uStack_a3 = 0;
      uStack_a2 = 0;
      local_98[0] = (value_type_conflict)uVar4;
      if (local_98[0] == 0) {
        lVar7 = 4;
        do {
          lVar11 = lVar7;
          if (lVar11 == 0x20) goto LAB_00131640;
          lVar7 = lVar11 + 4;
        } while (*(int *)((long)local_98 + lVar11) == 0);
        if (lVar11 == 0x20) {
LAB_00131640:
          uStack_a3 = 0x30;
          uVar9 = 0x55;
LAB_0013164a:
          if (show_pos && 0 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            local_f8[uVar9 & 0xffffffff] = 0x2b;
          }
          if (field_width != 0) {
            lVar7 = 0;
            if (field_width < 0x57) {
              lVar7 = 0x56 - field_width;
            }
            while (lVar7 < (long)uVar9) {
              uVar9 = uVar9 - 1;
              local_f8[uVar9 & 0xffffffff] = fill_char_str;
            }
          }
          uStack_a2 = 0;
          lVar7 = 0;
          do {
            bVar2 = local_f8[lVar7 + uVar9];
            str_result[lVar7] = bVar2;
            lVar7 = lVar7 + 1;
          } while (bVar2 != 0);
          return true;
        }
      }
      uVar9 = 0x56;
      local_98._0_8_ = uVar6;
      do {
        uVar4 = local_98._24_8_;
        if (local_98[0] == 0) {
          lVar7 = 4;
          do {
            bVar15 = lVar7 == 0x20;
            if (bVar15) break;
            piVar1 = (int *)((long)local_98 + lVar7);
            lVar7 = lVar7 + 4;
          } while (*piVar1 == 0);
        }
        else {
          bVar15 = false;
        }
        if ((uVar9 == 0) || (bVar15)) goto LAB_0013164a;
        local_48[0] = local_98[4];
        local_48[1] = local_98[5];
        avStack_40[0] = local_98[6];
        avStack_40[1] = local_98[7];
        local_58[0] = local_98[0];
        local_58[1] = local_98[1];
        avStack_50[0] = local_98[2];
        avStack_50[1] = local_98[3];
        lVar7 = 0x1c;
        uVar13 = 0;
        uVar10 = 0;
        do {
          uVar10 = CONCAT44((int)uVar10 + (int)uVar13 * -10,*(undefined4 *)((long)local_98 + lVar7))
          ;
          uVar13 = uVar10 / 10;
          *(int *)((long)local_98 + lVar7) = (int)uVar13;
          uVar6 = local_98._24_8_;
          lVar7 = lVar7 + -4;
        } while (lVar7 != -4);
        local_98[0xc] = local_98[4];
        local_98[0xd] = local_98[5];
        local_98[0xe] = local_98[6];
        local_98[0xf] = local_98[7];
        local_98[8] = local_98[0];
        local_98[9] = local_98[1];
        local_98[10] = local_98[2];
        local_98[0xb] = local_98[3];
        lVar7 = 0;
        uVar10 = 0;
        do {
          uVar10 = uVar10 + (ulong)local_98[lVar7 + 8] * 10;
          local_98[lVar7 + 8] = (value_type_conflict)uVar10;
          uVar10 = uVar10 >> 0x20;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        local_118.values.super_array<unsigned_int,_8UL>.elems[4] = local_98[4];
        local_118.values.super_array<unsigned_int,_8UL>.elems[5] = local_98[5];
        local_98[6] = (value_type_conflict)uVar4;
        local_98[7] = SUB84(uVar4,4);
        local_118.values.super_array<unsigned_int,_8UL>.elems[6] = local_98[6];
        local_118.values.super_array<unsigned_int,_8UL>.elems[7] = local_98[7];
        local_118.values.super_array<unsigned_int,_8UL>.elems[0] = local_98[0];
        local_118.values.super_array<unsigned_int,_8UL>.elems[1] = local_98[1];
        local_118.values.super_array<unsigned_int,_8UL>.elems[2] = local_98[2];
        local_118.values.super_array<unsigned_int,_8UL>.elems[3] = local_98[3];
        lVar7 = 0;
        bVar15 = false;
        do {
          uVar10 = ((ulong)local_118.values.super_array<unsigned_int,_8UL>.elems[lVar7] -
                   (ulong)bVar15) - (ulong)local_98[lVar7 + 8];
          local_118.values.super_array<unsigned_int,_8UL>.elems[lVar7] = (value_type_conflict)uVar10
          ;
          bVar15 = uVar10 >> 0x20 != 0;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 8);
        local_98._24_8_ = uVar6;
        local_f8[uVar9 - 1 & 0xffffffff] =
             (byte)local_118.values.super_array<unsigned_int,_8UL>.elems[0] + 0x30;
        uVar9 = uVar9 - 1;
      } while( true );
    }
    if (iVar12 != 8) {
      return false;
    }
    uVar4 = *(undefined8 *)this;
    local_118.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
    local_118.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
    local_118.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar4;
    local_118.values.super_array<unsigned_int,_8UL>.elems[1] = SUB84(uVar4,4);
    local_118.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
    uStack_a8 = 0;
    uStack_a3 = 0;
    uStack_a2 = 0;
    uStack_a1 = 0;
    uStack_9c = 0;
    uStack_9b = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_aa = 0;
    uStack_a9 = 0;
    local_f8[0x30] = 0;
    local_f8[0x31] = 0;
    local_f8[0x32] = 0;
    local_f8[0x33] = 0;
    local_f8[0x34] = 0;
    local_f8[0x35] = 0;
    local_f8[0x36] = 0;
    local_f8[0x37] = 0;
    local_f8[0x38] = 0;
    local_f8[0x39] = 0;
    local_f8[0x3a] = 0;
    local_f8[0x3b] = 0;
    local_f8[0x3c] = 0;
    local_f8[0x3d] = 0;
    local_f8[0x3e] = 0;
    local_f8[0x3f] = 0;
    local_f8[0x20] = 0;
    local_f8[0x21] = 0;
    local_f8[0x22] = 0;
    local_f8[0x23] = 0;
    local_f8[0x24] = 0;
    local_f8[0x25] = 0;
    local_f8[0x26] = 0;
    local_f8[0x27] = 0;
    local_f8[0x28] = 0;
    local_f8[0x29] = 0;
    local_f8[0x2a] = 0;
    local_f8[0x2b] = 0;
    local_f8[0x2c] = 0;
    local_f8[0x2d] = 0;
    local_f8[0x2e] = 0;
    local_f8[0x2f] = 0;
    local_f8[0x10] = 0;
    local_f8[0x11] = 0;
    local_f8[0x12] = 0;
    local_f8[0x13] = 0;
    local_f8[0x14] = 0;
    local_f8[0x15] = 0;
    local_f8[0x16] = 0;
    local_f8[0x17] = 0;
    local_f8[0x18] = 0;
    local_f8[0x19] = 0;
    local_f8[0x1a] = 0;
    local_f8[0x1b] = 0;
    local_f8[0x1c] = 0;
    local_f8[0x1d] = 0;
    local_f8[0x1e] = 0;
    local_f8[0x1f] = 0;
    local_f8[0] = 0;
    local_f8[1] = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[4] = 0;
    local_f8[5] = 0;
    local_f8[6] = 0;
    local_f8[7] = 0;
    local_f8[8] = 0;
    local_f8[9] = 0;
    local_f8[10] = 0;
    local_f8[0xb] = 0;
    local_f8[0xc] = 0;
    local_f8[0xd] = 0;
    local_f8[0xe] = 0;
    local_f8[0xf] = 0;
    local_118.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar4;
    vVar5 = local_118.values.super_array<unsigned_int,_8UL>.elems[0];
    if (local_118.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
      lVar7 = 4;
      do {
        lVar11 = lVar7;
        if (lVar11 == 0x20) goto LAB_00131778;
        lVar7 = lVar11 + 4;
      } while (*(int *)((long)local_118.values.super_array<unsigned_int,_8UL>.elems + lVar11) == 0);
      if (lVar11 == 0x20) {
LAB_00131778:
        uStack_9c = 0x30;
        uVar9 = 0x5c;
LAB_00131782:
        if (show_base && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_f8[uVar9 & 0xffffffff] = 0x30;
        }
        if (show_pos && 0 < (long)uVar9) {
          uVar9 = uVar9 - 1;
          local_f8[uVar9 & 0xffffffff] = 0x2b;
        }
        if (field_width != 0) {
          lVar7 = 0;
          if (field_width < 0x5e) {
            lVar7 = 0x5d - field_width;
          }
          while (lVar7 < (long)uVar9) {
            uVar9 = uVar9 - 1;
            local_f8[uVar9 & 0xffffffff] = fill_char_str;
          }
        }
        uStack_9b = 0;
        lVar7 = 0;
        do {
          bVar2 = local_f8[lVar7 + uVar9];
          str_result[lVar7] = bVar2;
          lVar7 = lVar7 + 1;
        } while (bVar2 != 0);
        return true;
      }
    }
    uVar9 = 0x5d;
    do {
      if (vVar5 == 0) {
        lVar7 = 4;
        do {
          bVar15 = lVar7 == 0x20;
          if (bVar15) break;
          piVar1 = (int *)((long)local_118.values.super_array<unsigned_int,_8UL>.elems + lVar7);
          lVar7 = lVar7 + 4;
        } while (*piVar1 == 0);
      }
      else {
        bVar15 = false;
      }
      uVar10 = uVar9 - 1;
      if ((uVar9 == 0) || (bVar15)) goto LAB_00131782;
      local_118.values.super_array<unsigned_int,_8UL>.elems[0]._0_1_ = (byte)uVar4;
      local_f8[uVar10 & 0xffffffff] =
           (byte)local_118.values.super_array<unsigned_int,_8UL>.elems[0] & 7 | 0x30;
      uVar14 = 0;
      lVar7 = 0x1c;
      do {
        uVar3 = *(uint *)((long)local_118.values.super_array<unsigned_int,_8UL>.elems + lVar7);
        *(uint *)((long)local_118.values.super_array<unsigned_int,_8UL>.elems + lVar7) =
             uVar3 >> 3 | uVar14;
        uVar14 = uVar3 << 0x1d;
        lVar7 = lVar7 + -4;
        uVar9 = uVar10;
      } while (lVar7 != -4);
    } while( true );
  }
  uVar4 = *(undefined8 *)this;
  local_118.values.super_array<unsigned_int,_8UL>.elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_118.values.super_array<unsigned_int,_8UL>.elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_118.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar4;
  local_118.values.super_array<unsigned_int,_8UL>.elems[1] = SUB84(uVar4,4);
  uVar6 = local_118.values.super_array<unsigned_int,_8UL>.elems._0_8_;
  local_118.values.super_array<unsigned_int,_8UL>.elems._8_8_ = *(undefined8 *)(this + 8);
  local_f8[0x30] = 0;
  local_f8[0x31] = 0;
  local_f8[0x32] = 0;
  local_f8[0x33] = 0;
  local_f8[0x34] = 0;
  local_f8[0x35] = 0;
  local_f8[0x36] = 0;
  local_f8[0x37] = 0;
  local_f8[0x38] = 0;
  local_f8[0x39] = 0;
  local_f8[0x3a] = 0;
  local_f8[0x3b] = 0;
  local_f8[0x3c] = 0;
  local_f8[0x3d] = 0;
  local_f8[0x3e] = 0;
  local_f8[0x3f] = 0;
  local_f8[0x20] = 0;
  local_f8[0x21] = 0;
  local_f8[0x22] = 0;
  local_f8[0x23] = 0;
  local_f8[0x24] = 0;
  local_f8[0x25] = 0;
  local_f8[0x26] = 0;
  local_f8[0x27] = 0;
  local_f8[0x28] = 0;
  local_f8[0x29] = 0;
  local_f8[0x2a] = 0;
  local_f8[0x2b] = 0;
  local_f8[0x2c] = 0;
  local_f8[0x2d] = 0;
  local_f8[0x2e] = 0;
  local_f8[0x2f] = 0;
  local_f8[0x10] = 0;
  local_f8[0x11] = 0;
  local_f8[0x12] = 0;
  local_f8[0x13] = 0;
  local_f8[0x14] = 0;
  local_f8[0x15] = 0;
  local_f8[0x16] = 0;
  local_f8[0x17] = 0;
  local_f8[0x18] = 0;
  local_f8[0x19] = 0;
  local_f8[0x1a] = 0;
  local_f8[0x1b] = 0;
  local_f8[0x1c] = 0;
  local_f8[0x1d] = 0;
  local_f8[0x1e] = 0;
  local_f8[0x1f] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[6] = 0;
  local_f8[7] = 0;
  local_f8[8] = 0;
  local_f8[9] = 0;
  local_f8[10] = 0;
  local_f8[0xb] = 0;
  local_f8[0xc] = 0;
  local_f8[0xd] = 0;
  local_f8[0xe] = 0;
  local_f8[0xf] = 0;
  local_b8 = 0;
  local_118.values.super_array<unsigned_int,_8UL>.elems[0] = (value_type_conflict)uVar4;
  if (local_118.values.super_array<unsigned_int,_8UL>.elems[0] == 0) {
    lVar7 = 4;
    do {
      lVar11 = lVar7;
      if (lVar11 == 0x20) goto LAB_001316c9;
      lVar7 = lVar11 + 4;
    } while (*(int *)((long)local_118.values.super_array<unsigned_int,_8UL>.elems + lVar11) == 0);
    if (lVar11 == 0x20) {
LAB_001316c9:
      local_b8 = 0x30000000000000;
      uVar9 = 0x46;
      goto LAB_001316d3;
    }
  }
  local_118.values.super_array<unsigned_int,_8UL>.elems._0_8_ = uVar6;
  uVar8 = uintwide_t<256U,_unsigned_int,_void,_false>::extract_hex_digits<false,_nullptr>
                    (&local_118,(char *)((long)&local_b8 + 7),is_uppercase);
  uVar9 = 0x47 - uVar8;
LAB_001316d3:
  if ((show_base) && (1 < (long)uVar9)) {
    local_f8[(int)uVar9 - 1] = !is_uppercase << 5 | 0x58;
    uVar9 = uVar9 - 2;
    local_f8[uVar9 & 0xffffffff] = 0x30;
  }
  if ((show_pos) && (0 < (long)uVar9)) {
    uVar9 = uVar9 - 1;
    local_f8[uVar9 & 0xffffffff] = 0x2b;
  }
  if (field_width != 0) {
    lVar7 = 0;
    if (field_width < 0x48) {
      lVar7 = 0x47 - field_width;
    }
    while (lVar7 < (long)uVar9) {
      uVar9 = uVar9 - 1;
      local_f8[uVar9 & 0xffffffff] = fill_char_str;
    }
  }
  local_b8 = local_b8 & 0xffffffffffffff;
  lVar7 = 0;
  do {
    bVar2 = local_f8[lVar7 + uVar9];
    str_result[lVar7] = bVar2;
    lVar7 = lVar7 + 1;
  } while (bVar2 != 0);
  return true;
}

Assistant:

constexpr auto wr_string(      OutputStrIterator  str_result, // NOLINT(readability-function-cognitive-complexity)
                             const std::uint_fast8_t  base_rep      = static_cast<std::uint_fast8_t>(UINT8_C(0x10)),
                             const bool               show_base     = true,
                             const bool               show_pos      = false,
                             const bool               is_uppercase  = true,
                                   unsigned_fast_type field_width   = static_cast<unsigned_fast_type>(UINT8_C(0)),
                             const char               fill_char_str = '0') const -> bool
    {
      auto wr_string_is_ok = true;

      if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(8)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        const auto mask = static_cast<limb_type>(static_cast<std::uint8_t>(0x7U));

        using string_storage_oct_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_oct()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_oct(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_oct_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_oct_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_oct_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) })) // NOLINT(altera-id-dependent-backward-branch)
          {
            auto c = static_cast<char>(*t.values.cbegin() & mask);

            if(c <= static_cast<char>(INT8_C(8))) { c = static_cast<char>(c + static_cast<char>(INT8_C(0x30))); }

            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = c;

            t >>= static_cast<unsigned>(UINT8_C(3));
          }
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_oct_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_oct_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(10)))
      {
        uintwide_t t(*this);

        const auto str_has_neg_sign = is_neg(t);

        if(str_has_neg_sign)
        {
          t.negate();
        }

        using string_storage_dec_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_dec()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_dec(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_dec_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_dec_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_dec_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '0';
        }
        else
        {
          while(!t.is_zero() && (pos > signed_fast_type { UINT8_C(0) }))
          {
            const uintwide_t tmp(t);

            t.eval_divide_by_single_limb(static_cast<limb_type>(UINT8_C(10)), 0U, nullptr);

            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] =
              static_cast<char>
              (
                  static_cast<limb_type>
                  (
                    tmp - (uintwide_t(t).mul_by_limb(static_cast<limb_type>(UINT8_C(10))))
                  )
                + static_cast<limb_type>(UINT8_C(0x30))
              );
          }
        }

        if(pos > signed_fast_type { UINT8_C(0) })
        {
          if(show_pos && (!str_has_neg_sign))
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '+';
          }
          else if(str_has_neg_sign)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = '-';
          }
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_dec_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_dec_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else if(base_rep == static_cast<std::uint_fast8_t>(UINT8_C(16)))
      {
        uintwide_t<my_width2, limb_type, AllocatorType, false> t(*this);

        using string_storage_hex_type =
          std::conditional_t
            <my_width2 <= static_cast<size_t>(UINT32_C(2048)),
             detail::fixed_static_array <char,
                                         wr_string_max_buffer_size_hex()>,
             detail::fixed_dynamic_array<char,
                                         wr_string_max_buffer_size_hex(),
                                         typename std::allocator_traits<std::conditional_t<std::is_same<AllocatorType, void>::value,
                                                                                           std::allocator<void>,
                                                                                           AllocatorType>>::template rebind_alloc<limb_type>>>;

        static_assert(string_storage_hex_type::static_size() > unsigned_fast_type { UINT8_C(1) },
                      "Error: String storage length must be greater than one");

        string_storage_hex_type str_temp { }; // LCOV_EXCL_LINE

        signed_fast_type
          pos
          {
            static_cast<signed_fast_type>
            (
              string_storage_hex_type::static_size() - static_cast<size_t>(UINT8_C(1)) // LCOV_EXCL_LINE
            )
          };

        if(t.is_zero())
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }
        else
        {
          const auto dst =
            extract_hex_digits<false>
            (
              t,
              &str_temp[static_cast<typename string_storage_hex_type::size_type>(pos)],
              is_uppercase
            );

          pos -= static_cast<signed_fast_type>(dst);
        }

        if(show_base && (pos > signed_fast_type { UINT8_C(1) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = (is_uppercase ? 'X' : 'x');

          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '0';
        }

        if(show_pos && (pos > signed_fast_type { UINT8_C(0) }))
        {
          str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = '+';
        }

        if(field_width != static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          field_width = (detail::min_unsafe)(field_width, static_cast<unsigned_fast_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))); // LCOV_EXCL_LINE

          while(static_cast<signed_fast_type>(pos) > static_cast<signed_fast_type>((str_temp.size() - static_cast<size_t>(UINT8_C(1))) - field_width)) // NOLINT(altera-id-dependent-backward-branch)
          {
            str_temp[static_cast<typename string_storage_hex_type::size_type>(--pos)] = fill_char_str;
          }
        }

        str_temp[static_cast<typename string_storage_hex_type::size_type>(str_temp.size() - static_cast<size_t>(UINT8_C(1)))] = '\0';

        detail::strcpy_unsafe(str_result, str_temp.data() + pos);
      }
      else
      {
        wr_string_is_ok = false;
      }

      return wr_string_is_ok;
    }